

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Board.cpp
# Opt level: O0

SolveResult __thiscall Board::backtrack(Board *this,tile_index index,SolveResult *result)

{
  bool bVar1;
  size_type sVar2;
  reference pvVar3;
  SolveResult SVar4;
  uint local_2c;
  uint i;
  SolveResult *result_local;
  Board *pBStack_18;
  tile_index index_local;
  Board *this_local;
  SolveResult r;
  
  result_local._4_4_ = index;
  pBStack_18 = this;
  sVar2 = std::vector<Tile,_std::allocator<Tile>_>::size(&this->_tiles);
  if (index == sVar2) {
    result->solved = true;
    this_local = *(Board **)result;
  }
  else {
    pvVar3 = std::vector<Tile,_std::allocator<Tile>_>::operator[]
                       (&this->_tiles,(ulong)result_local._4_4_);
    if (pvVar3->status == Solved) {
      SVar4 = backtrack(this,result_local._4_4_ + 1,result);
      this_local._0_5_ = SVar4._0_5_;
      if (((ulong)SVar4 & 0x100000000) != 0) {
        return (SolveResult)this_local;
      }
    }
    else {
      for (local_2c = 0; local_2c < this->SIZE; local_2c = local_2c + 1) {
        pvVar3 = std::vector<Tile,_std::allocator<Tile>_>::operator[]
                           (&this->_tiles,(ulong)result_local._4_4_);
        pvVar3->value = local_2c + One;
        pvVar3 = std::vector<Tile,_std::allocator<Tile>_>::operator[]
                           (&this->_tiles,(ulong)result_local._4_4_);
        pvVar3->status = Processing;
        bVar1 = isTileInsertionValid(this,(tile_index *)((long)&result_local + 4));
        if (bVar1) {
          SVar4 = backtrack(this,result_local._4_4_ + 1,result);
          this_local._0_5_ = SVar4._0_5_;
          if (((ulong)SVar4 & 0x100000000) != 0) {
            return (SolveResult)this_local;
          }
        }
      }
      pvVar3 = std::vector<Tile,_std::allocator<Tile>_>::operator[]
                         (&this->_tiles,(ulong)result_local._4_4_);
      pvVar3->value = Empty;
      pvVar3 = std::vector<Tile,_std::allocator<Tile>_>::operator[]
                         (&this->_tiles,(ulong)result_local._4_4_);
      pvVar3->status = Empty;
    }
    result->backtracks = result->backtracks + 1;
    result->solved = false;
    this_local = *(Board **)result;
  }
  return (SolveResult)this_local;
}

Assistant:

SolveResult Board::backtrack(tile_index index, SolveResult &result)
{
	if (index == _tiles.size())
	{
		result.solved = true;
		return result;
	}

	if (_tiles[index].status != TileStatus::Solved)
	{
		for (unsigned int i = 0; i < Board::SIZE; ++i)
		{
			_tiles[index].value = (TileValue)(i + 1);
			_tiles[index].status = TileStatus::Processing;

			if (isTileInsertionValid(index))
			{
				auto r = backtrack(index + 1, result);
				if (r.solved)
					return r;
			}
		}

		_tiles[index].value = TileValue::Empty;
		_tiles[index].status = TileStatus::Empty;
	}
	else
	{
		auto r = backtrack(index + 1, result);
		if (r.solved)
			return r;
	}

	++result.backtracks;
	result.solved = false;
	return result;
}